

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void funnelsort<16u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  uchar *__s1;
  uchar *__s2;
  size_t n0;
  unsigned_long uVar3;
  int iVar4;
  uchar **ppuVar5;
  byte bVar6;
  unsigned_long uVar7;
  byte bVar8;
  long lVar9;
  uchar **ppuVar10;
  array<unsigned_long,_16UL> buffer_count;
  array<Stream,_16UL> streams;
  array<unsigned_char_*,_336UL> buffers;
  fill<16U,_2U,_buffer_layout_bfs> local_c51;
  uchar **local_c50;
  uchar **local_c48;
  size_t local_c40;
  array<unsigned_long,_16UL> local_c38;
  long lStack_bb8;
  array<Stream,_16UL> local_bb0;
  uchar *local_ab0 [8];
  undefined8 local_a70 [8];
  undefined1 auStack_a30 [2560];
  
  if (n < 0x20) {
    ppuVar5 = strings;
    if (1 < (long)n) {
      do {
        iVar4 = (int)n;
        n = (size_t)(iVar4 - 1);
        pbVar1 = ppuVar5[1];
        for (ppuVar10 = ppuVar5 + 1; strings < ppuVar10; ppuVar10 = ppuVar10 + -1) {
          pbVar2 = ppuVar10[-1];
          bVar6 = *pbVar2;
          bVar8 = *pbVar1;
          if (bVar6 != 0 && bVar6 == bVar8) {
            lVar9 = 1;
            do {
              bVar6 = pbVar2[lVar9];
              bVar8 = pbVar1[lVar9];
              if (bVar6 == 0) break;
              lVar9 = lVar9 + 1;
            } while (bVar6 == bVar8);
          }
          if (bVar6 <= bVar8) break;
          *ppuVar10 = pbVar2;
        }
        *ppuVar10 = pbVar1;
        ppuVar5 = ppuVar5 + 1;
      } while (2 < iVar4);
    }
  }
  else {
    local_bb0._M_elems[0].n = n >> 4;
    local_bb0._M_elems[0].stream = strings;
    lVar9 = 0x18;
    do {
      *(size_t *)((long)&lStack_bb8 + lVar9) =
           *(long *)((long)local_c38._M_elems + lVar9 + 0x70) + local_bb0._M_elems[0].n * 8;
      *(size_t *)((long)&local_bb0._M_elems[0].stream + lVar9) = local_bb0._M_elems[0].n;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xf8);
    local_bb0._M_elems[0xf].stream = local_bb0._M_elems[0xe].stream + local_bb0._M_elems[0].n;
    local_bb0._M_elems[0xf].n = local_bb0._M_elems[0].n * -0xf + n;
    lVar9 = 8;
    local_c50 = strings;
    local_c40 = n;
    do {
      funnelsort<8u,buffer_layout_bfs>
                (*(uchar ***)((long)&lStack_bb8 + lVar9),
                 *(size_t *)((long)&local_bb0._M_elems[0].stream + lVar9),tmp);
      check_input(*(uchar ***)((long)&lStack_bb8 + lVar9),
                  *(size_t *)((long)&local_bb0._M_elems[0].stream + lVar9));
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x108);
    local_c38._M_elems[0xe] = 0;
    local_c38._M_elems[0xf] = 0;
    local_c38._M_elems[0xc] = 0;
    local_c38._M_elems[0xd] = 0;
    local_c38._M_elems[10] = 0;
    local_c38._M_elems[0xb] = 0;
    local_c38._M_elems[8] = 0;
    local_c38._M_elems[9] = 0;
    local_c38._M_elems[6] = 0;
    local_c38._M_elems[7] = 0;
    local_c38._M_elems[4] = 0;
    local_c38._M_elems[5] = 0;
    local_c38._M_elems[2] = 0;
    local_c38._M_elems[3] = 0;
    local_c38._M_elems[0] = 0;
    local_c38._M_elems[1] = 0;
    local_c48 = tmp;
    while ((local_c38._M_elems[2] != 0 ||
           (fill<16U,_2U,_buffer_layout_bfs>::operator()(&local_c51,&local_bb0,local_ab0,&local_c38)
           , local_c38._M_elems[2] != 0))) {
      if ((local_c38._M_elems[3] == 0) &&
         (fill<16U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c51,&local_bb0,local_ab0,&local_c38)
         , local_c38._M_elems[3] == 0)) {
        if (local_c38._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        while (uVar3 = local_c38._M_elems[2], local_c38._M_elems[2] != 0) {
          memmove(tmp,local_a70 + -local_c38._M_elems[2],
                  (long)local_a70 - (long)(local_a70 + -local_c38._M_elems[2]));
          tmp = tmp + uVar3;
          local_c38._M_elems[2] = 0;
          fill<16U,_2U,_buffer_layout_bfs>::operator()(&local_c51,&local_bb0,local_ab0,&local_c38);
        }
        goto LAB_001253e5;
      }
      uVar7 = local_c38._M_elems[3];
      uVar3 = local_c38._M_elems[2];
      __s1 = local_ab0[8 - local_c38._M_elems[2]];
      if (__s1 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_a70[8 - local_c38._M_elems[3]];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)__s1,(char *)__s2);
      if (iVar4 < 1) {
        uVar7 = uVar3;
        __s2 = __s1;
      }
      *tmp = __s2;
      local_c38._M_elems[(ulong)(0 < iVar4) + 2] = uVar7 - 1;
      tmp = tmp + 1;
    }
    if (local_c38._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar3 = local_c38._M_elems[3];
      if (local_c38._M_elems[3] != 0) {
        if (local_c38._M_elems[3] * 8 != 0) {
          memmove(tmp,auStack_a30 + local_c38._M_elems[3] * -8,local_c38._M_elems[3] * 8);
        }
        tmp = tmp + uVar3;
        local_c38._M_elems[3] = 0;
        fill<16U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c51,&local_bb0,local_ab0,&local_c38);
      }
    } while (uVar3 != 0);
LAB_001253e5:
    n0 = local_c40;
    ppuVar5 = local_c50;
    memcpy(local_c50,local_c48,local_c40 * 8);
    check_input(ppuVar5,n0);
  }
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}